

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

void SoftForkDescPushBack
               (CBlockIndex *blockindex,UniValue *softforks,ChainstateManager *chainman,
               BuriedDeployment dep)

{
  bool bVar1;
  BuriedDeployment in_CX;
  UniValue *in_RSI;
  long in_FS_OFFSET;
  UniValue rv;
  undefined6 in_stack_fffffffffffffd18;
  BuriedDeployment in_stack_fffffffffffffd1e;
  ChainstateManager *in_stack_fffffffffffffd20;
  CBlockIndex *in_stack_fffffffffffffd28;
  BuriedDeployment dep_00;
  undefined4 in_stack_fffffffffffffd30;
  VType in_stack_fffffffffffffd34;
  UniValue *in_stack_fffffffffffffd38;
  UniValue *in_stack_fffffffffffffd50;
  UniValue *val;
  UniValue *this;
  UniValue *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  allocator<char> local_264;
  undefined1 local_263;
  undefined1 local_262;
  undefined1 local_261 [481];
  UniValue local_80;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = DeploymentEnabled<Consensus::BuriedDeployment>
                    ((ChainstateManager *)
                     CONCAT26(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18),0);
  if (bVar1) {
    this_00 = &local_80;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    UniValue::UniValue(in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,
                       (string *)in_stack_fffffffffffffd28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18));
    this = (UniValue *)local_261;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd68,(char *)this_00,(allocator<char> *)this);
    UniValue::UniValue<const_char_(&)[7],_char[7],_true>(this_00,(char (*) [7])this);
    UniValue::pushKV(this_00,(string *)this,in_stack_fffffffffffffd50);
    UniValue::~UniValue((UniValue *)CONCAT26(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18));
    std::allocator<char>::~allocator((allocator<char> *)local_261);
    val = (UniValue *)&local_262;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd68,(char *)this_00,(allocator<char> *)this);
    local_263 = DeploymentActiveAfter<Consensus::BuriedDeployment>
                          (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                           in_stack_fffffffffffffd1e);
    dep_00 = (BuriedDeployment)((ulong)in_stack_fffffffffffffd28 >> 0x30);
    UniValue::UniValue<bool,_bool,_true>(this,(bool *)val);
    UniValue::pushKV(this_00,(string *)this,val);
    UniValue::~UniValue((UniValue *)CONCAT26(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18));
    std::allocator<char>::~allocator((allocator<char> *)&local_262);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd68,(char *)this_00,(allocator<char> *)this);
    ChainstateManager::GetConsensus
              ((ChainstateManager *)CONCAT26(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18));
    Consensus::Params::DeploymentHeight
              ((Params *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),dep_00);
    UniValue::UniValue<int,_int,_true>(this,(int *)val);
    UniValue::pushKV(this_00,(string *)this,val);
    UniValue::~UniValue((UniValue *)CONCAT26(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18));
    std::allocator<char>::~allocator(&local_264);
    DeploymentName_abi_cxx11_(in_CX);
    UniValue::UniValue(in_RSI,(UniValue *)(local_261 + 1));
    UniValue::pushKV(this_00,(string *)this,val);
    UniValue::~UniValue((UniValue *)CONCAT26(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18));
    UniValue::~UniValue((UniValue *)CONCAT26(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void SoftForkDescPushBack(const CBlockIndex* blockindex, UniValue& softforks, const ChainstateManager& chainman, Consensus::BuriedDeployment dep)
{
    // For buried deployments.

    if (!DeploymentEnabled(chainman, dep)) return;

    UniValue rv(UniValue::VOBJ);
    rv.pushKV("type", "buried");
    // getdeploymentinfo reports the softfork as active from when the chain height is
    // one below the activation height
    rv.pushKV("active", DeploymentActiveAfter(blockindex, chainman, dep));
    rv.pushKV("height", chainman.GetConsensus().DeploymentHeight(dep));
    softforks.pushKV(DeploymentName(dep), std::move(rv));
}